

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# TextBox.cpp
# Opt level: O2

shared_ptr<gui::TextBox> __thiscall
gui::TextBox::create(TextBox *this,shared_ptr<gui::TextBoxStyle> *style,String *name)

{
  TextBox *this_00;
  __shared_count<(__gnu_cxx::_Lock_policy)2> extraout_RDX;
  shared_ptr<gui::TextBox> sVar1;
  __shared_ptr<gui::TextBoxStyle,_(__gnu_cxx::_Lock_policy)2> local_40;
  
  this_00 = (TextBox *)operator_new(0x3a8);
  std::__shared_ptr<gui::TextBoxStyle,_(__gnu_cxx::_Lock_policy)2>::__shared_ptr
            (&local_40,&style->super___shared_ptr<gui::TextBoxStyle,_(__gnu_cxx::_Lock_policy)2>);
  TextBox(this_00,(shared_ptr<gui::TextBoxStyle> *)&local_40,name);
  std::__shared_ptr<gui::TextBox,(__gnu_cxx::_Lock_policy)2>::__shared_ptr<gui::TextBox,void>
            ((__shared_ptr<gui::TextBox,(__gnu_cxx::_Lock_policy)2> *)this,this_00);
  std::__shared_count<(__gnu_cxx::_Lock_policy)2>::~__shared_count(&local_40._M_refcount);
  sVar1.super___shared_ptr<gui::TextBox,_(__gnu_cxx::_Lock_policy)2>._M_refcount._M_pi =
       extraout_RDX._M_pi;
  sVar1.super___shared_ptr<gui::TextBox,_(__gnu_cxx::_Lock_policy)2>._M_ptr = this;
  return (shared_ptr<gui::TextBox>)
         sVar1.super___shared_ptr<gui::TextBox,_(__gnu_cxx::_Lock_policy)2>;
}

Assistant:

std::shared_ptr<TextBox> TextBox::create(std::shared_ptr<TextBoxStyle> style, const sf::String& name) {
    return std::shared_ptr<TextBox>(new TextBox(style, name));
}